

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

string * pbrt::RemoveExtension(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  size_type sVar2;
  string ext;
  string local_60;
  path local_40;
  
  filesystem::path::path(&local_40,filename);
  filesystem::path::extension_abi_cxx11_(&local_60,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40.m_path);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  if (local_60._M_string_length == 0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
    sVar2 = __return_storage_ptr__->_M_string_length;
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    __return_storage_ptr__->_M_string_length = sVar2 + ~local_60._M_string_length;
    pcVar1[~local_60._M_string_length + sVar2] = '\0';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RemoveExtension(const std::string &filename) {
    std::string ext = filesystem::path(filename).extension();
    if (ext.empty())
        return filename;
    std::string f = filename;
    f.erase(f.end() - ext.size() - 1, f.end());
    return f;
}